

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t **ppuVar1;
  byte bVar2;
  uint16_t *puVar3;
  roaring_array_t *prVar4;
  _Bool _Var5;
  long lVar6;
  array_container_t *paVar7;
  uint64_t uVar8;
  array_container_t *src_1;
  container_t *c;
  byte bVar9;
  array_container_t *paVar10;
  byte bVar11;
  int iVar12;
  uint start_index;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  uint end_index;
  int iVar17;
  int i;
  ulong uVar18;
  uint16_t uVar19;
  bool bVar20;
  uint8_t result_type;
  uint8_t local_70;
  byte local_6f;
  uint16_t local_6e;
  uint local_6c;
  array_container_t *local_68;
  ulong local_60;
  ulong local_58;
  roaring_array_t *local_50;
  array_container_t *local_48;
  uint local_3c;
  array_container_t *local_38;
  ulong uVar13;
  
  local_70 = '\0';
  local_6c = (x2->high_low_container).size;
  if (local_6c == 0) {
    return;
  }
  uVar15 = (x1->high_low_container).size;
  local_50 = &x2->high_low_container;
  if (uVar15 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar19 = *(x1->high_low_container).keys;
  uVar14 = *(x2->high_low_container).keys;
  iVar17 = uVar15 - 1;
  uVar13 = 0;
  lVar6 = 0;
LAB_001171db:
  uVar16 = (ulong)uVar15;
  local_6e = CONCAT11(local_6e._1_1_,local_6f);
  end_index = local_6c;
  do {
    prVar4 = local_50;
    uVar18 = (ulong)(int)lVar6;
    while( true ) {
      i = (int)uVar18;
      if (uVar19 == uVar14) break;
      if (uVar14 <= uVar19) {
        local_6f = local_50->typecodes[uVar13 & 0xffff];
        local_6e = uVar14;
        local_60 = uVar16;
        c = get_copy_of_container
                      (local_50->containers[uVar13 & 0xffff],&local_6f,(_Bool)(local_50->flags & 1))
        ;
        uVar14 = local_6e;
        iVar12 = (int)uVar13;
        if ((prVar4->flags & 1) != 0) {
          if (((roaring_array_t *)&local_50->size)->size <= iVar12) goto LAB_001177d2;
          local_50->containers[iVar12] = c;
          local_50->typecodes[iVar12] = local_6f;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,i,local_6e,c,local_6f);
        start_index = iVar12 + 1;
        uVar13 = (ulong)start_index;
        if (start_index != local_6c) {
          uVar14 = local_50->keys[uVar13 & 0xffff];
        }
        lVar6 = uVar18 + 1;
        uVar15 = (int)local_60 + 1;
        iVar17 = iVar17 + 1;
        end_index = local_6c;
        if (start_index == local_6c) goto LAB_0011774e;
        goto LAB_001171db;
      }
      if (iVar17 == i) goto LAB_00117746;
      uVar18 = uVar18 + 1;
      uVar19 = (x1->high_low_container).keys[uVar18 & 0xffff];
    }
    bVar2 = (x1->high_low_container).typecodes[uVar18 & 0xffff];
    src_1 = (array_container_t *)(x1->high_low_container).containers[uVar18 & 0xffff];
    paVar10 = src_1;
    bVar11 = bVar2;
    if (bVar2 == 4) {
      bVar11 = *(byte *)&src_1->array;
      if (bVar11 == 4) goto LAB_001177a3;
      paVar10 = *(array_container_t **)src_1;
    }
    if (bVar11 != 3) {
      if ((bVar11 != 2) && (bVar11 != 1)) {
        local_6f = (byte)local_6e;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1110,"_Bool container_is_full(const container_t *, uint8_t)");
      }
      bVar20 = paVar10->cardinality == 0x10000;
LAB_0011725d:
      if (!bVar20) goto LAB_00117268;
      goto LAB_00117312;
    }
    if ((paVar10->cardinality == 1) && (*paVar10->array == 0)) {
      bVar20 = paVar10->array[1] == 0xffff;
      goto LAB_0011725d;
    }
LAB_00117268:
    bVar11 = local_50->typecodes[uVar13 & 0xffff];
    local_6e = CONCAT11(local_6e._1_1_,bVar11);
    paVar10 = (array_container_t *)local_50->containers[uVar13 & 0xffff];
    local_3c = (uint)bVar2;
    local_58 = uVar13;
    if (bVar2 == 4) {
      local_60 = uVar16;
      paVar7 = (array_container_t *)container_or(src_1,'\x04',paVar10,bVar11,&local_70);
      end_index = local_6c;
      paVar10 = local_48;
      goto LAB_001172ca;
    }
    bVar9 = bVar11;
    if (bVar11 == 4) {
      ppuVar1 = &paVar10->array;
      local_60 = uVar16;
      if (*(byte *)ppuVar1 == 4) {
LAB_001177a3:
        local_6f = (byte)local_6e;
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      paVar10 = *(array_container_t **)paVar10;
      bVar9 = *(byte *)ppuVar1;
    }
    local_48 = (array_container_t *)0x0;
    paVar7 = src_1;
    switch((uint)bVar9 + (uint)bVar2 * 4) {
    case 5:
      local_68 = src_1;
      local_60 = uVar16;
      bitset_container_or((bitset_container_t *)src_1,(bitset_container_t *)paVar10,
                          (bitset_container_t *)src_1);
      src_1 = local_68;
      if (local_68->cardinality == 0x10000) {
        paVar7 = (array_container_t *)run_container_create_given_capacity(1);
        if (paVar7 != (array_container_t *)0x0) {
          puVar3 = paVar7->array;
          iVar12 = paVar7->cardinality;
          (puVar3 + (long)iVar12 * 2)[0] = 0;
          (puVar3 + (long)iVar12 * 2)[1] = 0xffff;
          paVar7->cardinality = iVar12 + 1;
        }
        local_70 = '\x03';
        src_1 = local_68;
        end_index = local_6c;
        paVar10 = paVar7;
      }
      else {
LAB_001175cd:
        local_70 = '\x01';
        paVar7 = src_1;
        end_index = local_6c;
        paVar10 = local_48;
      }
      break;
    case 6:
      local_60 = uVar16;
      uVar8 = bitset_set_list_withcard
                        ((uint64_t *)src_1->array,(long)src_1->cardinality,paVar10->array,
                         (long)paVar10->cardinality);
      src_1->cardinality = (int32_t)uVar8;
      paVar10 = src_1;
LAB_001175bb:
      local_70 = '\x01';
      paVar7 = src_1;
      src_1 = paVar10;
      end_index = local_6c;
      paVar10 = local_48;
      break;
    case 7:
      if (((paVar10->cardinality != 1) || (*paVar10->array != 0)) || (paVar10->array[1] != 0xffff))
      {
        local_60 = uVar16;
        run_bitset_container_union
                  ((run_container_t *)paVar10,(bitset_container_t *)src_1,
                   (bitset_container_t *)src_1);
        goto LAB_001175cd;
      }
      local_68 = src_1;
      local_60 = uVar16;
      paVar7 = (array_container_t *)malloc(0x10);
      if (paVar7 == (array_container_t *)0x0) {
        paVar7 = (array_container_t *)0x0;
      }
      else {
        paVar7->cardinality = 0;
        paVar7->capacity = 0;
        paVar7->array = (uint16_t *)0x0;
      }
      local_70 = '\x03';
      local_48 = paVar7;
      run_container_copy((run_container_t *)paVar10,(run_container_t *)paVar7);
      src_1 = local_68;
      end_index = local_6c;
      paVar10 = local_48;
      break;
    default:
      local_6f = bVar11;
      local_60 = uVar16;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1553,
                    "container_t *container_ior(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                   );
    case 9:
      local_68 = src_1;
      local_60 = uVar16;
      paVar7 = (array_container_t *)bitset_container_create();
      local_70 = '\x01';
      local_48 = paVar7;
      array_bitset_container_union
                (local_68,(bitset_container_t *)paVar10,(bitset_container_t *)paVar7);
      src_1 = local_68;
      end_index = local_6c;
      paVar10 = local_48;
      break;
    case 10:
      local_60 = uVar16;
      _Var5 = array_array_container_inplace_union(src_1,paVar10,&local_48);
      local_70 = '\x02' - _Var5;
      if (local_48 != (array_container_t *)0x0) {
        paVar7 = local_48;
      }
      end_index = local_6c;
      paVar10 = local_48;
      if (_Var5) {
        paVar7 = local_48;
      }
      break;
    case 0xb:
      local_68 = src_1;
      local_60 = uVar16;
      local_48 = (array_container_t *)malloc(0x10);
      if (local_48 == (array_container_t *)0x0) {
        local_48 = (array_container_t *)0x0;
      }
      else {
        local_48->cardinality = 0;
        local_48->capacity = 0;
        local_48->array = (uint16_t *)0x0;
      }
      local_38 = local_48;
      array_run_container_union(local_68,(run_container_t *)paVar10,(run_container_t *)local_48);
      paVar7 = (array_container_t *)
               convert_run_to_efficient_container((run_container_t *)local_38,&local_70);
      src_1 = local_68;
      end_index = local_6c;
      paVar10 = paVar7;
      if (paVar7 != local_38) {
        run_container_free((run_container_t *)local_38);
        src_1 = local_68;
        end_index = local_6c;
      }
      break;
    case 0xd:
      if (((src_1->cardinality != 1) || (*src_1->array != 0)) || (src_1->array[1] != 0xffff)) {
        local_68 = src_1;
        local_60 = uVar16;
        src_1 = (array_container_t *)bitset_container_create();
        local_48 = src_1;
        run_bitset_container_union
                  ((run_container_t *)local_68,(bitset_container_t *)paVar10,
                   (bitset_container_t *)src_1);
        paVar10 = local_68;
        goto LAB_001175bb;
      }
      local_70 = '\x03';
      local_60 = uVar16;
      paVar10 = local_48;
      break;
    case 0xe:
      local_68 = src_1;
      local_60 = uVar16;
      array_run_container_inplace_union(paVar10,(run_container_t *)src_1);
      goto LAB_001174e5;
    case 0xf:
      local_68 = src_1;
      local_60 = uVar16;
      run_container_union_inplace((run_container_t *)src_1,(run_container_t *)paVar10);
LAB_001174e5:
      paVar7 = (array_container_t *)
               convert_run_to_efficient_container((run_container_t *)local_68,&local_70);
      src_1 = local_68;
      end_index = local_6c;
      paVar10 = local_48;
    }
LAB_001172ca:
    local_48 = paVar10;
    uVar16 = local_60;
    if (paVar7 != src_1) {
      local_68 = paVar7;
      container_free(src_1,(uint8_t)local_3c);
      paVar7 = local_68;
      end_index = local_6c;
    }
    if ((x1->high_low_container).size <= i) {
      local_6f = (byte)local_6e;
LAB_001177d2:
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a3a,
                    "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                   );
    }
    (x1->high_low_container).containers[uVar18] = paVar7;
    (x1->high_low_container).typecodes[uVar18] = local_70;
    uVar13 = local_58;
LAB_00117312:
    lVar6 = uVar18 + 1;
    uVar15 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar15;
    if (uVar15 == end_index || iVar17 == i) {
LAB_00117746:
      start_index = (uint)uVar13;
      uVar15 = (uint)uVar16;
      local_6f = (byte)local_6e;
LAB_0011774e:
      if (i + 1U != uVar15) {
        return;
      }
      ra_append_copy_range
                (&x1->high_low_container,local_50,start_index,end_index,(_Bool)(local_50->flags & 1)
                );
      return;
    }
    uVar19 = (x1->high_low_container).keys[(uint)lVar6 & 0xffff];
    uVar14 = local_50->keys[uVar15 & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,
                               const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            if (!container_is_full(c1, type1)) {
                container_t *c2 = ra_get_container_at_index(
                                        &x2->high_low_container, pos2, &type2);
                container_t *c =
                    (type1 == SHARED_CONTAINER_TYPE)
                        ? container_or(c1, type1, c2, type2, &result_type)
                        : container_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            // container_t *c2_clone = container_clone(c2, type2);
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}